

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O2

void quest_chat(monst *mtmp)

{
  uchar uVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  
  if (mtmp->m_id == quest_status.leader_m_id) {
    chat_with_leader();
    return;
  }
  uVar1 = mtmp->data->msound;
  if (uVar1 != '!') {
    if (uVar1 == ' ') {
      uVar2 = mt_random();
      qt_pager(uVar2 % 10 + 0x3c);
      if (((uint)quest_status._0_4_ >> 0xd & 1) == 0) {
        quest_status._0_4_ = quest_status._0_4_ | 0x2000;
      }
      return;
    }
    pcVar3 = mon_nam(mtmp);
    impossible("quest_chat: Unknown quest character %s.",pcVar3);
    return;
  }
  if (((u.uhave._0_1_ & 0x10) == 0) || ((quest_status._0_4_ & 0x4000) == 0)) {
    iVar4 = 5;
  }
  else {
    iVar4 = 10;
  }
  uVar2 = mt_random();
  qt_pager(iVar4 + uVar2 % 5);
  return;
}

Assistant:

void quest_chat(struct monst *mtmp)
{
    if (mtmp->m_id == Qstat(leader_m_id)) {
	chat_with_leader();
	return;
    }
    switch(mtmp->data->msound) {
	    case MS_NEMESIS:	chat_with_nemesis(); break;
	    case MS_GUARDIAN:	chat_with_guardian(); break;
	    default:	impossible("quest_chat: Unknown quest character %s.",
				   mon_nam(mtmp));
	}
}